

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit.cc
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Process with time limit...");
  std::endl<char,std::char_traits<char>>(poVar1);
  ProcessByTime();
  poVar1 = std::operator<<((ostream *)&std::cerr,"Process with count limit...");
  std::endl<char,std::char_traits<char>>(poVar1);
  ProcessByCount();
  poVar1 = std::operator<<((ostream *)&std::cerr,"Process without limit...");
  std::endl<char,std::char_traits<char>>(poVar1);
  ResourceConsumingWorker();
  return 0;
}

Assistant:

int main() {
  std::cerr << "Process with time limit..." << std::endl;
  ProcessByTime();
  std::cerr << "Process with count limit..." << std::endl;
  ProcessByCount();
  std::cerr << "Process without limit..." << std::endl;
  ResourceConsumingWorker();
}